

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteDescriptor
          (ReflectionClassGenerator *this,Printer *printer)

{
  string *psVar1;
  bool bVar2;
  Options *pOVar3;
  FileDescriptor *pFVar4;
  Nonnull<const_char_*> failure_msg;
  FileDescriptor *descriptor;
  char *extraout_RDX;
  FileDescriptor *descriptor_00;
  char *descriptor_01;
  EnumDescriptor *extraout_RDX_00;
  EnumDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *descriptor_02;
  FieldDescriptor *extraout_RDX_05;
  int index;
  long lVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view filename;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string base64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  LogMessageFatal local_40;
  
  psVar1 = this->file_->name_;
  local_78._M_string_length = (size_type)(psVar1->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)psVar1->_M_string_length;
  text._M_str = 
  "#region Descriptor\n/// <summary>File descriptor for $file_name$</summary>\npublic static pbr::FileDescriptor Descriptor {\n  get { return descriptor; }\n}\nprivate static pbr::FileDescriptor descriptor;\n\nstatic $reflection_class_name$() {\n"
  ;
  text._M_len = 0xeb;
  io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[22],std::__cxx11::string>
            (printer,text,(char (*) [10])0x13a96f5,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_78,(char (*) [22])0x133b593,
             &this->reflectionClassname_);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_00._M_str = "byte[] descriptorData = global::System.Convert.FromBase64String(\n";
  text_00._M_len = 0x41;
  io::Printer::Print<>(printer,text_00);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  text_01._M_str = "string.Concat(\n";
  text_01._M_len = 0xf;
  io::Printer::Print<>(printer,text_01);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  if (pOVar3->strip_nonfunctional_codegen == true) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,anon_var_dwarf_a12c75 + 5);
  }
  else {
    FileDescriptorToBase64_abi_cxx11_(&local_78,(csharp *)this->file_,descriptor);
  }
  if (&DAT_0000003c < local_78._M_string_length) {
    do {
      std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_78);
      text_02._M_str = "\"$base64$\",\n";
      text_02._M_len = 0xc;
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,text_02,(char (*) [7])"base64",&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_78);
      std::__cxx11::string::operator=((string *)&local_78,(string *)&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    } while (&DAT_0000003c < local_78._M_string_length);
  }
  text_03._M_str = "\"$base64$\"));\n";
  text_03._M_len = 0xe;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text_03,(char (*) [7])"base64",&local_78)
  ;
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  text_04._M_str = "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n";
  text_04._M_len = 0x43;
  io::Printer::Print<>(printer,text_04);
  text_05._M_str = "    new pbr::FileDescriptor[] { ";
  text_05._M_len = 0x20;
  io::Printer::Print<>(printer,text_05);
  if (0 < this->file_->dependency_count_) {
    index = 0;
    do {
      pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      if (pOVar3->strip_nonfunctional_codegen == true) {
        pFVar4 = FileDescriptor::dependency(this->file_,index);
        filename._M_str = extraout_RDX;
        filename._M_len = (size_t)(pFVar4->name_->_M_dataplus)._M_p;
        bVar2 = IsKnownFeatureProto((compiler *)pFVar4->name_->_M_string_length,filename);
        if (!bVar2) goto LAB_00e1f951;
      }
      else {
LAB_00e1f951:
        pFVar4 = FileDescriptor::dependency(this->file_,index);
        GetReflectionClassName_abi_cxx11_(&local_98,(csharp *)pFVar4,descriptor_00);
        text_06._M_str = "$full_reflection_class_name$.Descriptor, ";
        text_06._M_len = 0x29;
        io::Printer::Print<char[27],std::__cxx11::string>
                  (printer,text_06,(char (*) [27])"full_reflection_class_name",&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      index = index + 1;
    } while (index < this->file_->dependency_count_);
  }
  text_07._M_str = "},\n    new pbr::GeneratedClrTypeInfo(";
  text_07._M_len = 0x25;
  io::Printer::Print<>(printer,text_07);
  if (this->file_->enum_type_count_ < 1) {
    descriptor_01 = "null, ";
    sVar6 = 6;
  }
  else {
    text_08._M_str = "new[] {";
    text_08._M_len = 7;
    io::Printer::Print<>(printer,text_08);
    pFVar4 = this->file_;
    descriptor_01 = "}, ";
    sVar6 = 3;
    if (0 < pFVar4->enum_type_count_) {
      lVar7 = 0;
      lVar5 = 0;
      do {
        GetClassName_abi_cxx11_
                  (&local_98,(csharp *)(&pFVar4->enum_types_->super_SymbolBase + lVar7),
                   (EnumDescriptor *)descriptor_01);
        text_09._M_str = "typeof($type_name$), ";
        text_09._M_len = 0x15;
        io::Printer::Print<char[10],std::__cxx11::string>
                  (printer,text_09,(char (*) [10])0x13f0e18,&local_98);
        descriptor_01 = (char *)extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          descriptor_01 = (char *)extraout_RDX_01;
        }
        lVar5 = lVar5 + 1;
        pFVar4 = this->file_;
        lVar7 = lVar7 + 0x58;
      } while (lVar5 < pFVar4->enum_type_count_);
      descriptor_01 = "}, ";
      sVar6 = 3;
    }
  }
  text_10._M_str = descriptor_01;
  text_10._M_len = sVar6;
  io::Printer::Print<>(printer,text_10);
  if (this->file_->extension_count_ < 1) {
    text_12._M_str = "null, ";
    text_12._M_len = 6;
    io::Printer::Print<>(printer,text_12);
  }
  else {
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_58,(long)this->file_->extension_count_);
    pFVar4 = this->file_;
    if (0 < pFVar4->extension_count_) {
      lVar7 = 0;
      lVar5 = 0;
      descriptor_02 = extraout_RDX_02;
      do {
        if (lVar5 < pFVar4->extension_count_) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (lVar5,(long)pFVar4->extension_count_,"index < extension_count()")
          ;
          descriptor_02 = extraout_RDX_05;
        }
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xaec,failure_msg);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        GetFullExtensionName_abi_cxx11_
                  (&local_98,(csharp *)(&pFVar4->extensions_->super_SymbolBase + lVar7),
                   descriptor_02);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
                   &local_98);
        descriptor_02 = extraout_RDX_03;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          descriptor_02 = extraout_RDX_04;
        }
        lVar5 = lVar5 + 1;
        pFVar4 = this->file_;
        lVar7 = lVar7 + 0x58;
      } while (lVar5 < pFVar4->extension_count_);
    }
    absl::lts_20250127::strings_internal::
    JoinAlgorithm<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              (&local_98,
               (strings_internal *)
               local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,2,", ");
    text_11._M_str = "new pb::Extension[] { $extensions$ }, ";
    text_11._M_len = 0x26;
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,text_11,(char (*) [11])0x1146603,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
  }
  if (this->file_->message_type_count_ < 1) {
    text_15._M_str = "null));\n";
    text_15._M_len = 8;
    io::Printer::Print<>(printer,text_15);
  }
  else {
    text_13._M_str = "new pbr::GeneratedClrTypeInfo[] {\n";
    text_13._M_len = 0x22;
    io::Printer::Print<>(printer,text_13);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 3;
    pFVar4 = this->file_;
    if (0 < pFVar4->message_type_count_) {
      lVar5 = 0;
      uVar8 = 0;
      do {
        WriteGeneratedCodeInfo
                  (this,(Descriptor *)(&pFVar4->message_types_->super_SymbolBase + lVar5),printer,
                   uVar8 == this->file_->message_type_count_ - 1);
        uVar8 = uVar8 + 1;
        pFVar4 = this->file_;
        lVar5 = lVar5 + 0xa0;
      } while ((long)uVar8 < (long)pFVar4->message_type_count_);
    }
    io::Printer::Outdent(printer);
    text_14._M_str = "\n}));\n";
    text_14._M_len = 6;
    io::Printer::Print<>(printer,text_14);
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
  }
  io::Printer::Outdent(printer);
  text_16._M_str = "}\n";
  text_16._M_len = 2;
  io::Printer::Print<>(printer,text_16);
  text_17._M_str = "#endregion\n\n";
  text_17._M_len = 0xc;
  io::Printer::Print<>(printer,text_17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ReflectionClassGenerator::WriteDescriptor(io::Printer* printer) {
  printer->Print(
    "#region Descriptor\n"
    "/// <summary>File descriptor for $file_name$</summary>\n"
    "public static pbr::FileDescriptor Descriptor {\n"
    "  get { return descriptor; }\n"
    "}\n"
    "private static pbr::FileDescriptor descriptor;\n"
    "\n"
    "static $reflection_class_name$() {\n",
    "file_name", file_->name(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
  printer->Print(
    "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  printer->Indent();
  printer->Indent();
  printer->Print("string.Concat(\n");
  printer->Indent();

  // TODO: Consider a C#-escaping format here instead of just Base64.
  std::string base64 = options()->strip_nonfunctional_codegen
                           ? ""
                           : FileDescriptorToBase64(file_);
  while (base64.size() > 60) {
    printer->Print("\"$base64$\",\n", "base64", base64.substr(0, 60));
    base64 = base64.substr(60);
  }
  printer->Print("\"$base64$\"));\n", "base64", base64);
  printer->Outdent();
  printer->Outdent();
  printer->Outdent();

  // -----------------------------------------------------------------
  // Invoke InternalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  printer->Print("    new pbr::FileDescriptor[] { ");
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (options()->strip_nonfunctional_codegen &&
        IsKnownFeatureProto(file_->dependency(i)->name())) {
      // Strip feature imports for editions codegen tests.
      continue;
    }
    printer->Print("$full_reflection_class_name$.Descriptor, ",
                   "full_reflection_class_name",
                   GetReflectionClassName(file_->dependency(i)));
  }
  printer->Print("},\n"
      "    new pbr::GeneratedClrTypeInfo(");
  // Specify all the generated code information, recursively.
  if (file_->enum_type_count() > 0) {
      printer->Print("new[] {");
      for (int i = 0; i < file_->enum_type_count(); i++) {
          printer->Print("typeof($type_name$), ", "type_name", GetClassName(file_->enum_type(i)));
      }
      printer->Print("}, ");
  }
  else {
      printer->Print("null, ");
  }  
  if (file_->extension_count() > 0) {
    std::vector<std::string> extensions;
    extensions.reserve(file_->extension_count());
    for (int i = 0; i < file_->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(file_->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", absl::StrJoin(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }
  if (file_->message_type_count() > 0) {
      printer->Print("new pbr::GeneratedClrTypeInfo[] {\n");
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < file_->message_type_count(); i++) {
          WriteGeneratedCodeInfo(file_->message_type(i), printer, i == file_->message_type_count() - 1);
      }
      printer->Outdent();
      printer->Print("\n}));\n");
      printer->Outdent();
      printer->Outdent();
  }
  else {
      printer->Print("null));\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endregion\n\n");
}